

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::blend_equation_advanced
               (NegativeTestContext *ctx)

{
  char *__s;
  string shaderSource;
  size_t sVar1;
  long lVar2;
  ostringstream source;
  undefined1 *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  long in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "GL_KHR_blend_equation_advanced features require enabling the extension in 310 es shaders."
             ,"");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  lVar2 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#version 310 es\nlayout(",0x17);
    __s = *(char **)((long)blend_equation_advanced::s_qualifiers + lVar2);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,") out;\nvoid main()\n{\n}\n",0x17);
    std::__cxx11::stringbuf::str();
    shaderSource._M_string_length = in_stack_fffffffffffffe40;
    shaderSource._M_dataplus._M_p = in_stack_fffffffffffffe38;
    shaderSource.field_2._M_allocated_capacity = in_stack_fffffffffffffe48;
    shaderSource.field_2._8_8_ = in_stack_fffffffffffffe50;
    verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)&DAT_00000001,
                 (ShaderType)in_stack_fffffffffffffe38,shaderSource,
                 (ExpectResult)in_stack_fffffffffffffe40);
    if (in_stack_fffffffffffffe38 != &stack0xfffffffffffffe48) {
      operator_delete(in_stack_fffffffffffffe38,in_stack_fffffffffffffe48 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x78);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void blend_equation_advanced (NegativeTestContext& ctx)
{
	static const char* const s_qualifiers[] =
	{
		"blend_support_multiply",
		"blend_support_screen",
		"blend_support_overlay",
		"blend_support_darken",
		"blend_support_lighten",
		"blend_support_colordodge",
		"blend_support_colorburn",
		"blend_support_hardlight",
		"blend_support_softlight",
		"blend_support_difference",
		"blend_support_exclusion",
		"blend_support_hsl_hue",
		"blend_support_hsl_saturation",
		"blend_support_hsl_color",
		"blend_support_hsl_luminosity",
	};

	ctx.beginSection("GL_KHR_blend_equation_advanced features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_qualifiers); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"layout(" << s_qualifiers[ndx] << ") out;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}